

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSprite __thiscall DataSourceAmiga::get_map_object_sprite(DataSourceAmiga *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte compression_00;
  byte bVar2;
  unsigned_short uVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSprite PVar6;
  undefined4 in_stack_fffffffffffffedc;
  shared_ptr<Data::Sprite> local_c0;
  undefined1 local_b0 [8];
  PSpriteAmiga sprite;
  undefined1 local_90 [8];
  PSpriteAmiga pixels;
  undefined1 local_70 [8];
  PSpriteAmiga mask;
  undefined1 local_58 [4];
  int i;
  uint8_t filled;
  uint8_t compressed;
  uint8_t compression;
  uint8_t offset_y;
  uint8_t height;
  uint8_t width;
  uint16_t bitplane_size;
  shared_ptr<Buffer> local_40;
  undefined1 local_30 [8];
  PBuffer data;
  size_t index_local;
  DataSourceAmiga *this_local;
  
  data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  std::shared_ptr<Buffer>::shared_ptr(&local_40,(shared_ptr<Buffer> *)(index + 0x58));
  get_data_from_catalog((DataSourceAmiga *)local_30,index,6,(PBuffer *)in_RDX);
  std::shared_ptr<Buffer>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    Buffer::pop<unsigned_short>(peVar4);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    uVar3 = Buffer::pop<unsigned_short>(peVar4);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    i._1_1_ = Buffer::pop<unsigned_char>(peVar4);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    compression_00 = Buffer::pop<unsigned_char>(peVar4);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    bVar2 = Buffer::pop<unsigned_char>(peVar4);
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    local_58[2] = Buffer::pop<unsigned_char>(peVar4);
    if (compression_00 == 0) {
      std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
    }
    else {
      if (i._1_1_ == 0) {
        i._1_1_ = (byte)((ulong)uVar3 / (ulong)(long)(int)(uint)compression_00);
      }
      local_58[1] = 0;
      local_58[0] = 0;
      for (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ = 0;
          mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ < 2;
          mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ =
               mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ + 1) {
        local_58[1] = (undefined1)((int)(uint)(byte)local_58[1] >> 1);
        local_58[0] = (undefined1)((int)(uint)(byte)local_58[0] >> 1);
        if ((local_58[2] & 0x80) != 0) {
          local_58[1] = local_58[1] | 0x10;
          if ((local_58[2] & 0x40) != 0) {
            local_58[0] = local_58[0] | 0x10;
          }
          local_58[2] = local_58[2] << 1;
        }
        local_58[2] = local_58[2] << 1;
      }
      this_00 = &pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
      std::shared_ptr<Buffer>::shared_ptr
                ((shared_ptr<Buffer> *)this_00,(shared_ptr<Buffer> *)local_30);
      decode_mask_sprite((DataSourceAmiga *)local_70,(PBuffer *)index,(size_t)this_00,
                         (ulong)i._1_1_ << 3);
      std::shared_ptr<Buffer>::~shared_ptr
                ((shared_ptr<Buffer> *)
                 &pixels.
                  super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
      Buffer::pop_tail((Buffer *)
                       &sprite.
                        super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
      decode_planned_sprite
                ((DataSourceAmiga *)local_90,(PBuffer *)index,
                 (size_t)&sprite.
                          super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,(ulong)i._1_1_,compression_00,local_58[1],
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffedc,(uint)(byte)local_58[0]),true);
      std::shared_ptr<Buffer>::~shared_ptr
                ((shared_ptr<Buffer> *)
                 &sprite.
                  super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar5 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>
                (&local_c0,(shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_70);
      SpriteAmiga::get_amiga_masked((SpriteAmiga *)local_b0,(PSprite *)peVar5);
      std::shared_ptr<Data::Sprite>::~shared_ptr(&local_c0);
      peVar5 = std::
               __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_b0);
      SpriteAmiga::set_delta(peVar5,1,0);
      if ((data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x80) ||
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8f <
          data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)) {
        peVar5 = std::
                 __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b0);
        SpriteAmiga::set_offset(peVar5,(uint)i._1_1_ * -4,-(uint)bVar2);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b0);
        SpriteAmiga::set_offset(peVar5,0,-(uint)bVar2);
      }
      std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>
                ((shared_ptr<Data::Sprite> *)this,
                 (shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_b0);
      std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
                ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_b0);
      std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
                ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_90);
      std::shared_ptr<DataSourceAmiga::SpriteAmiga>::~shared_ptr
                ((shared_ptr<DataSourceAmiga::SpriteAmiga> *)local_70);
    }
  }
  else {
    std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_30);
  PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar6.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_map_object_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(6, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  data->pop<uint16_t>();  // drop shadow_offset
  uint16_t bitplane_size = data->pop<uint16_t>();
  uint8_t width = data->pop<uint8_t>();
  uint8_t height = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (height == 0) {
    return nullptr;
  }
  if (width == 0) {
    width = bitplane_size / height;
  }

  uint8_t compressed = 0;
  uint8_t filled = 0;
  for (int i = 0 ; i < 2 ; i++) {
    compressed  = compressed >> 1;
    filled = filled >> 1;

    if (compression & 0x80) {
      compressed = compressed | 0x10;
      if (compression & 0x40) {
        filled = filled | 0x10;
      }
      compression = compression << 1;
    }
    compression = compression << 1;
  }

  PSpriteAmiga mask = decode_mask_sprite(data, width * 8, height);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, height,
                                              compressed, filled, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  sprite->set_delta(1, 0);
  if ((index >= 128) && (index <= 143)) {
    sprite->set_offset(0, -offset_y);
  } else {
    sprite->set_offset(-width * 4, -offset_y);
  }

  return sprite;
}